

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

InsertionResult * __thiscall
QHashPrivate::Data<QHashPrivate::Node<void_const_volatile*,void_const*>>::
findOrInsert<void_const_volatile*>
          (Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_> *this,void **key)

{
  bool bVar1;
  Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_> *in_RSI;
  Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_> *in_RDI;
  long in_FS_OFFSET;
  Bucket BVar2;
  iterator iVar3;
  size_t hash;
  Bucket it;
  Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_> *this_00;
  undefined1 in_stack_ffffffffffffffc8 [16];
  Span *in_stack_ffffffffffffffd8;
  undefined1 *local_20;
  Bucket local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
  local_18.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_>::Bucket::Bucket
            (&local_18,(Span *)0x0,0);
  calculateHash<void_const_volatile*>((void **)this_00,(size_t)in_RDI);
  if (in_RSI->numBuckets != 0) {
    BVar2 = findBucketWithHash<void_const_volatile*>
                      ((Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_> *)
                       in_stack_ffffffffffffffd8,in_stack_ffffffffffffffc8._8_8_,
                       in_stack_ffffffffffffffc8._0_8_);
    in_stack_ffffffffffffffd8 = BVar2.span;
    local_20 = (undefined1 *)BVar2.index;
    local_18.index = (size_t)local_20;
    local_18.span = in_stack_ffffffffffffffd8;
    bVar1 = Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_>::Bucket::isUnused
                      ((Bucket *)0x6341cf);
    if (!bVar1) {
      iVar3 = Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_>::Bucket::toIterator
                        ((Bucket *)this_00,in_RDI);
      *(iterator *)in_RDI = iVar3;
      *(undefined1 *)&in_RDI->numBuckets = 1;
      goto LAB_00634289;
    }
  }
  bVar1 = Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_>::shouldGrow(in_RSI);
  if (bVar1) {
    Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_>::rehash(this,(size_t)key);
    BVar2 = findBucketWithHash<void_const_volatile*>
                      ((Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_> *)
                       in_stack_ffffffffffffffd8,in_stack_ffffffffffffffc8._8_8_,
                       in_stack_ffffffffffffffc8._0_8_);
    local_18.span = BVar2.span;
    local_18.index = BVar2.index;
  }
  Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_>::Bucket::insert((Bucket *)0x63425a)
  ;
  in_RSI->size = in_RSI->size + 1;
  iVar3 = Data<QHashPrivate::Node<const_volatile_void_*,_const_void_*>_>::Bucket::toIterator
                    ((Bucket *)this_00,in_RDI);
  *(iterator *)in_RDI = iVar3;
  *(undefined1 *)&in_RDI->numBuckets = 0;
LAB_00634289:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (InsertionResult *)this_00;
}

Assistant:

InsertionResult findOrInsert(const K &key) noexcept
    {
        Bucket it(static_cast<Span *>(nullptr), 0);
        size_t hash = QHashPrivate::calculateHash(key, seed);
        if (numBuckets > 0) {
            it = findBucketWithHash(key, hash);
            if (!it.isUnused())
                return { it.toIterator(this), true };
        }
        if (shouldGrow()) {
            rehash(size + 1);
            it = findBucketWithHash(key, hash); // need to get a new iterator after rehashing
        }
        Q_ASSERT(it.span != nullptr);
        Q_ASSERT(it.isUnused());
        it.insert();
        ++size;
        return { it.toIterator(this), false };
    }